

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

bool pybind11::operator!=(iterator *a,iterator *b)

{
  PyObject *pPVar1;
  iterator *self_1;
  iterator *self;
  
  if (((a->super_object).super_handle.m_ptr != (PyObject *)0x0) &&
     ((a->value).super_handle.m_ptr == (PyObject *)0x0)) {
    iterator::advance(a);
  }
  pPVar1 = (a->value).super_handle.m_ptr;
  if (((b->super_object).super_handle.m_ptr != (PyObject *)0x0) &&
     ((b->value).super_handle.m_ptr == (PyObject *)0x0)) {
    iterator::advance(b);
  }
  return pPVar1 != (b->value).super_handle.m_ptr;
}

Assistant:

bool operator!=(const iterator &a, const iterator &b) { return a->ptr() != b->ptr(); }